

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

void Js::JavascriptOperators::
     PatchPutValueWithThisPtrNoLocalFastPath<true,Js::PolymorphicInlineCache>
               (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId,Var newValue,
               Var thisInstance,PropertyOperationFlags flags)

{
  Type *pTVar1;
  ImplicitCallFlags *pIVar2;
  Type TVar3;
  ImplicitCallFlags IVar4;
  bool bVar5;
  BOOL BVar6;
  ScriptContext *requestContext;
  JavascriptCopyOnAccessNativeIntArray *this;
  RecyclableObject *object;
  ScriptContext *pSVar7;
  ImplicitCallFlags IVar8;
  undefined1 local_b0 [8];
  PropertyValueInfo info;
  
  info._56_8_ = thisInstance;
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  bVar5 = VarIs<Js::RecyclableObject>(instance);
  if (bVar5) {
    if (instance != (Var)0x0) {
      bVar5 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(instance);
      if (bVar5) {
        this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(instance);
      }
      else {
        this = (JavascriptCopyOnAccessNativeIntArray *)0x0;
      }
      if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
      }
    }
    object = UnsafeVarTo<Js::RecyclableObject>(instance);
    local_b0 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_b0,functionBody,inlineCache,inlineCacheIndex,false);
    bVar5 = CacheOperators::TrySetProperty<false,true,true,true,true,false,true,false>
                      (object,false,propertyId,newValue,requestContext,flags,
                       (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_b0);
    if (!bVar5) {
      bVar5 = Phases::IsEnabled((Phases *)&DAT_015cd718,InlineCachePhase);
      if ((bVar5) && (DAT_015d346a == '\x01')) {
        CacheOperators::TraceCache
                  (inlineCache,L"PatchPutValueNoLocalFastPath",propertyId,requestContext,object);
      }
      TVar3 = (functionBody->super_ParseableFunctionInfo).flags;
      IVar8 = ImplicitCall_None;
      if ((TVar3 & Flags_HasOnlyThisStatements) != Flags_None) {
        IVar8 = requestContext->threadContext->implicitCallFlags;
        ThreadContext::ClearImplicitCallFlags(requestContext->threadContext);
      }
      BVar6 = OP_SetProperty(instance,propertyId,newValue,requestContext,
                             (PropertyValueInfo *)local_b0,flags,(Var)info._56_8_);
      if (BVar6 == 0) {
        pIVar2 = &requestContext->threadContext->implicitCallFlags;
        *pIVar2 = *pIVar2 | ImplicitCall_NoOpSet;
      }
      if ((TVar3 & Flags_HasOnlyThisStatements) != Flags_None) {
        pSVar7 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
        IVar4 = pSVar7->threadContext->implicitCallFlags;
        if (ImplicitCall_None < IVar4) {
          pTVar1 = &(functionBody->super_ParseableFunctionInfo).flags;
          *pTVar1 = *pTVar1 & (Flags_HasRestParameter|Flags_HasNoExplicitReturnValue|
                               Flags_NonUserCode|Flags_HasThis|Flags_HasTry|
                               Flags_HasOrParentHasArguments|Flags_StackNestedFunc);
        }
        requestContext->threadContext->implicitCallFlags = IVar4 | IVar8;
      }
    }
    return;
  }
  SetPropertyOnTaggedNumber
            (instance,(RecyclableObject *)0x0,propertyId,newValue,requestContext,flags);
  return;
}

Assistant:

inline void JavascriptOperators::PatchPutValueWithThisPtrNoLocalFastPath(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId, Var newValue, Var thisInstance, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchPutValueWithThisPtrNoLocalFastPath);
        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        if (TaggedNumber::Is(instance))
        {
            JavascriptOperators::SetPropertyOnTaggedNumber(instance,
                nullptr,
                propertyId,
                newValue,
                scriptContext,
                flags);
            return;
        }
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        RecyclableObject *object = UnsafeVarTo<RecyclableObject>(instance);

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        if (CacheOperators::TrySetProperty<!TInlineCache::IsPolymorphic, true, true, true, true, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false>(
            object, false, propertyId, newValue, scriptContext, flags, nullptr, &info))
        {
            return;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchPutValueNoLocalFastPath"), propertyId, scriptContext, object);
        }
#endif

        ImplicitCallFlags prevImplicitCallFlags = ImplicitCall_None;
        ImplicitCallFlags currImplicitCallFlags = ImplicitCall_None;
        bool hasThisOnlyStatements = functionBody->GetHasOnlyThisStmts();
        if (hasThisOnlyStatements)
        {
            prevImplicitCallFlags = CacheAndClearImplicitBit(scriptContext);
        }
        if (!JavascriptOperators::OP_SetProperty(instance, propertyId, newValue, scriptContext, &info, flags, thisInstance))
        {
            // Add implicit call flags, to bail out if field copy prop may propagate the wrong value.
            scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
        }
        if (hasThisOnlyStatements)
        {
            currImplicitCallFlags = CheckAndUpdateFunctionBodyWithImplicitFlag(functionBody);
            RestoreImplicitFlag(scriptContext, prevImplicitCallFlags, currImplicitCallFlags);
        }
        JIT_HELPER_END(Op_PatchPutValueWithThisPtrNoLocalFastPath);
    }